

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O2

set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *
anon_unknown.dwarf_642426::GetKeyData
          (set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *__return_storage_ptr__,
          FlatSigningProvider *provider,int flags)

{
  _Rb_tree_header *p_Var1;
  CPubKey *__v;
  byte bVar2;
  _Base_ptr p_Var3;
  size_t __n;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  undefined4 local_e8;
  undefined4 local_e4;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  CPubKey norm_pubkey;
  uchar bytes [33];
  uchar local_47 [15];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (provider->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(provider->pubkeys)._M_t._M_impl.super__Rb_tree_header) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    __v = (CPubKey *)((long)&p_Var3[1]._M_left + 4);
    if ((flags & 0x40U) == 0) {
      std::
      _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>::
      _M_insert_unique<CPubKey_const&>
                ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                  *)__return_storage_ptr__,__v);
    }
    else {
      local_c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_b8 = "";
      local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0x66;
      file.m_begin = (iterator)&local_c0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
      norm_pubkey.vch[8] = '\0';
      norm_pubkey.vch._0_8_ = &PTR__lazy_ostream_01139f30;
      norm_pubkey.vch._16_8_ = boost::unit_test::lazy_ostream::inst;
      norm_pubkey.vch._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/descriptor_tests.cpp"
      ;
      local_d8 = "";
      local_e4 = 0x21;
      if ((__v->vch[0] & 0xfe) != 2) {
        bVar2 = __v->vch[0] - 4;
        local_e4 = 0;
        if (bVar2 < 4) {
          local_e4 = *(undefined4 *)(&DAT_00b7c5d0 + (ulong)bVar2 * 4);
        }
      }
      local_e8 = 0x21;
      in_R8 = (iterator)0x2;
      in_R9 = (iterator)&local_e4;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
                (&norm_pubkey,&local_e0,0x66,1,2,in_R9,"pubkey.size()",&local_e8,"33",0x21);
      bVar2 = __v->vch[0];
      __n = 0x21;
      if ((bVar2 & 0xfe) == 2) {
LAB_003249a3:
        memmove(bytes,__v,__n);
      }
      else if (bVar2 < 8) {
        __n = 0x41;
        if ((0xd0U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_003249a3;
      }
      bytes[0] = '\x02';
      CPubKey::Set<unsigned_char_const*>(&norm_pubkey,bytes,local_47);
      std::
      _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>::
      _M_insert_unique<CPubKey_const&>
                ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                  *)__return_storage_ptr__,&norm_pubkey);
    }
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

std::set<CPubKey> GetKeyData(const FlatSigningProvider& provider, int flags) {
    std::set<CPubKey> ret;
    for (const auto& [_, pubkey] : provider.pubkeys) {
        if (flags & XONLY_KEYS) {
            unsigned char bytes[33];
            BOOST_CHECK_EQUAL(pubkey.size(), 33);
            std::copy(pubkey.begin(), pubkey.end(), bytes);
            bytes[0] = 0x02;
            CPubKey norm_pubkey{bytes};
            ret.insert(norm_pubkey);
        } else {
            ret.insert(pubkey);
        }
    }
    return ret;
}